

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

uint mergeSectUnion(Section *sect,SectionType type,uint32_t org,uint8_t alignment,
                   uint16_t alignOffset)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  
  if (0xf < alignment) {
    __assert_fail("alignment < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/section.cpp"
                  ,0x80,"mergeSectUnion");
  }
  if (type == SECTTYPE_INVALID) {
    __assert_fail("type != SECTTYPE_INVALID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                  ,0x65,"bool sect_HasData(enum SectionType)");
  }
  bVar3 = (type & ~SECTTYPE_VRAM) == SECTTYPE_ROMX;
  if (bVar3) {
    error("Cannot declare ROM sections as UNION\n");
  }
  uVar1 = (uint)bVar3;
  if (org == 0xffffffff) {
    if (alignment == '\0') {
      return uVar1;
    }
    if (sect->org == 0xffffffff) {
      if (((1 << (sect->align & 0x1f)) - 1U & (uint)alignOffset) ==
          (~(-1 << (alignment & 0x1f)) & (uint)sect->alignOfs)) {
        if (alignment <= sect->align) {
          return uVar1;
        }
        sect->align = alignment;
        sect->alignOfs = alignOffset;
        return uVar1;
      }
      pcVar2 = "Section already declared with incompatible %u-byte alignment (offset %u)\n";
      goto LAB_00113c1f;
    }
    if ((sect->org - (uint)alignOffset & ~(-1 << (alignment & 0x1f))) == 0) {
      return uVar1;
    }
    pcVar2 = "Section already declared as fixed at incompatible address $%04x\n";
  }
  else {
    if (sect->org == org || sect->org == 0xffffffff) {
      if ((sect->align == 0) || ((org - sect->alignOfs & (1 << (sect->align & 0x1f)) - 1U) == 0)) {
        sect->org = org;
        return uVar1;
      }
      pcVar2 = "Section already declared as aligned to %u bytes (offset %u)\n";
LAB_00113c1f:
      error(pcVar2);
      goto LAB_00113c26;
    }
    pcVar2 = "Section already declared as fixed at different address $%04x\n";
  }
  error(pcVar2);
LAB_00113c26:
  return uVar1 + 1;
}

Assistant:

static unsigned int mergeSectUnion(struct Section *sect, enum SectionType type, uint32_t org,
				   uint8_t alignment, uint16_t alignOffset)
{
	assert(alignment < 16); // Should be ensured by the caller
	unsigned int nbSectErrors = 0;

	// Unionized sections only need "compatible" constraints, and they end up with the strictest
	// combination of both.
	if (sect_HasData(type))
		fail("Cannot declare ROM sections as UNION\n");

	if (org != (uint32_t)-1) {
		// If both are fixed, they must be the same
		if (sect->org != (uint32_t)-1 && sect->org != org)
			fail("Section already declared as fixed at different address $%04"
			     PRIx32 "\n", sect->org);
		else if (sect->align != 0 && (mask(sect->align) & (org - sect->alignOfs)))
			fail("Section already declared as aligned to %u bytes (offset %"
				   PRIu16 ")\n", 1U << sect->align, sect->alignOfs);
		else
			// Otherwise, just override
			sect->org = org;

	} else if (alignment != 0) {
		// Make sure any fixed address given is compatible
		if (sect->org != (uint32_t)-1) {
			if ((sect->org - alignOffset) & mask(alignment))
				fail("Section already declared as fixed at incompatible address $%04"
				     PRIx32 "\n", sect->org);
		// Check if alignment offsets are compatible
		} else if ((alignOffset & mask(sect->align))
			   != (sect->alignOfs & mask(alignment))) {
			fail("Section already declared with incompatible %u"
			     "-byte alignment (offset %" PRIu16 ")\n",
			     1U << sect->align, sect->alignOfs);
		} else if (alignment > sect->align) {
			// If the section is not fixed, its alignment is the largest of both
			sect->align = alignment;
			sect->alignOfs = alignOffset;
		}
	}

	return nbSectErrors;
}